

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

TemplateString * __thiscall
ctemplate::TemplateDictionary::Memdup
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,char *s,size_t slen)

{
  char *s_00;
  size_t slen_local;
  char *s_local;
  TemplateDictionary *this_local;
  
  s_00 = UnsafeArena::MemdupPlusNUL(this->arena_,s,slen);
  TemplateString::TemplateString(__return_storage_ptr__,s_00,slen);
  return __return_storage_ptr__;
}

Assistant:

TemplateString TemplateDictionary::Memdup(const char* s, size_t slen) {
  return TemplateString(arena_->MemdupPlusNUL(s, slen), slen);  // add a \0 too
}